

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c9fea::AddInteractionBPM_duplicate_value_1_Test::
~AddInteractionBPM_duplicate_value_1_Test(AddInteractionBPM_duplicate_value_1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AddInteractionBPM, duplicate_value_1) {
   
   Polynomial<uint32_t, double> polynomial = GeneratePolynomialUINT();
   
   for (auto &&it: polynomial) {
      it.second /= 2;
   }
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   for (const auto &it: polynomial) {
      bpm.AddInteraction(it.first, it.second);
   };
   
   StateTestBPMUINT(bpm);

}